

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_tls.c
# Opt level: O2

int mbedtls_ssl_set_hs_psk(mbedtls_ssl_context *ssl,uchar *psk,size_t psk_len)

{
  mbedtls_ssl_handshake_params *pmVar1;
  int iVar2;
  uchar *__dest;
  
  iVar2 = -0x7100;
  if ((psk != (uchar *)0x0) &&
     (iVar2 = -0x7100, psk_len < 0x21 && ssl->handshake != (mbedtls_ssl_handshake_params *)0x0)) {
    free(ssl->handshake->psk);
    __dest = (uchar *)calloc(1,psk_len);
    pmVar1 = ssl->handshake;
    pmVar1->psk = __dest;
    if (__dest == (uchar *)0x0) {
      iVar2 = -0x7f00;
    }
    else {
      pmVar1->psk_len = psk_len;
      memcpy(__dest,psk,psk_len);
      iVar2 = 0;
    }
  }
  return iVar2;
}

Assistant:

int mbedtls_ssl_set_hs_psk( mbedtls_ssl_context *ssl,
                            const unsigned char *psk, size_t psk_len )
{
    if( psk == NULL || ssl->handshake == NULL )
        return( MBEDTLS_ERR_SSL_BAD_INPUT_DATA );

    if( psk_len > MBEDTLS_PSK_MAX_LEN )
        return( MBEDTLS_ERR_SSL_BAD_INPUT_DATA );

    if( ssl->handshake->psk != NULL )
        mbedtls_free( ssl->handshake->psk );

    if( ( ssl->handshake->psk = mbedtls_calloc( 1, psk_len ) ) == NULL )
        return( MBEDTLS_ERR_SSL_ALLOC_FAILED );

    ssl->handshake->psk_len = psk_len;
    memcpy( ssl->handshake->psk, psk, ssl->handshake->psk_len );

    return( 0 );
}